

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_global_encodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  ushort uVar1;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *fmt;
  uint c;
  JSRefCountHeader *p;
  long lVar7;
  ulong uVar8;
  JSValue v;
  JSValue v_00;
  JSValue JVar9;
  int64_t local_58;
  StringBuffer local_50;
  JSValueUnion JVar2;
  
  JVar9 = JS_ToStringInternal(ctx,*argv,0);
  local_58 = JVar9.tag;
  JVar2 = JVar9.u;
  if ((int)JVar9.tag != 6) {
    local_50.size = *(uint *)((long)JVar2.ptr + 4) & 0x7fffffff;
    local_50.len = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,local_50.size,0);
    if (local_50.str == (JSString *)0x0) {
      local_50.size = 0;
      local_50.error_status = -1;
    }
    uVar8 = *(ulong *)((long)JVar2.ptr + 4);
    uVar4 = (uint)uVar8 & 0x7fffffff;
    if ((uVar8 & 0x7fffffff) != 0) {
      uVar6 = 0;
      do {
        local_58 = JVar9.tag;
        iVar5 = (int)uVar6;
        lVar7 = (long)iVar5;
        uVar6 = lVar7 + 1;
        if ((int)uVar8 < 0) {
          uVar1 = *(ushort *)((long)JVar9.u.ptr + lVar7 * 2 + 0x10);
          c = (uint)uVar1;
          if (uVar1 < 0x100) goto LAB_00165767;
LAB_001657b3:
          if ((c & 0xfc00) == 0xd800) {
            if ((int)uVar6 < (int)uVar4) {
              if ((int)uVar8 < 0) {
                uVar4 = (uint)*(ushort *)((long)JVar2.ptr + lVar7 * 2 + 0x12);
              }
              else {
                uVar4 = (uint)*(byte *)((long)JVar2.ptr + lVar7 + 0x11);
              }
              if (0xfffffbff < uVar4 - 0xe000) {
                uVar6 = (ulong)(iVar5 + 2);
                c = (c & 0x3ff) * 0x400 + (uVar4 & 0x3ff) + 0x10000;
                encodeURI_hex(&local_50,c >> 0x12 | 0xf0);
                uVar4 = c >> 0xc & 0x3f | 0x80;
LAB_00165899:
                encodeURI_hex(&local_50,uVar4);
                uVar4 = c >> 6 & 0x3f | 0x80;
                goto LAB_001658b0;
              }
            }
            fmt = "expecting surrogate pair";
LAB_00165933:
            js_throw_URIError(ctx,fmt);
            if ((0xfffffff4 < (uint)JVar9.tag) &&
               (iVar5 = *JVar2.ptr, *(int *)JVar2.ptr = iVar5 + -1, iVar5 < 2)) {
              v_00.tag = local_58;
              v_00.u.ptr = JVar2.ptr;
              __JS_FreeValueRT(ctx->rt,v_00);
            }
            (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
            return (JSValue)(ZEXT816(6) << 0x40);
          }
          if ((c & 0xfc00) == 0xdc00) {
            fmt = "invalid character";
            goto LAB_00165933;
          }
          if (0x7f < c) {
            if (0x7ff < c) {
              uVar4 = c >> 0xc | 0xe0;
              goto LAB_00165899;
            }
            uVar4 = c >> 6 | 0xc0;
LAB_001658b0:
            encodeURI_hex(&local_50,uVar4);
            c = c & 0x3f | 0x80;
          }
          encodeURI_hex(&local_50,c);
        }
        else {
          c = (uint)*(byte *)((long)JVar9.u.ptr + lVar7 + 0x10);
LAB_00165767:
          if ((((9 < c - 0x30) && (0x19 < (c & 0xffffffdf) - 0x41)) &&
              (pvVar3 = memchr("-_.!~*\'()",c,9), pvVar3 == (void *)0x0)) &&
             ((isComponent != 0 || (pvVar3 = memchr(";/?:@&=+$,#",c,0xb), pvVar3 == (void *)0x0))))
          goto LAB_001657b3;
          string_buffer_putc16(&local_50,c);
        }
        JVar9.tag = local_58;
        JVar9.u.ptr = JVar2.ptr;
        uVar8 = *(ulong *)((long)JVar2.ptr + 4);
        uVar4 = (uint)uVar8 & 0x7fffffff;
      } while ((int)uVar6 < (int)uVar4);
    }
    if ((0xfffffff4 < (uint)local_58) &&
       (iVar5 = *JVar2.ptr, *(int *)JVar2.ptr = iVar5 + -1, iVar5 < 2)) {
      v.tag = local_58;
      v.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
    JVar9 = string_buffer_end(&local_50);
  }
  return JVar9;
}

Assistant:

static JSValue js_global_encodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        k++;
        if (isURIUnescaped(c, isComponent)) {
            string_buffer_putc16(b, c);
        } else {
            if (c >= 0xdc00 && c <= 0xdfff) {
                js_throw_URIError(ctx, "invalid character");
                goto fail;
            } else if (c >= 0xd800 && c <= 0xdbff) {
                if (k >= p->len) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c1 = string_get(p, k);
                k++;
                if (c1 < 0xdc00 || c1 > 0xdfff) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
            }
            if (c < 0x80) {
                encodeURI_hex(b, c);
            } else {
                /* XXX: use C UTF-8 conversion ? */
                if (c < 0x800) {
                    encodeURI_hex(b, (c >> 6) | 0xc0);
                } else {
                    if (c < 0x10000) {
                        encodeURI_hex(b, (c >> 12) | 0xe0);
                    } else {
                        encodeURI_hex(b, (c >> 18) | 0xf0);
                        encodeURI_hex(b, ((c >> 12) & 0x3f) | 0x80);
                    }
                    encodeURI_hex(b, ((c >> 6) & 0x3f) | 0x80);
                }
                encodeURI_hex(b, (c & 0x3f) | 0x80);
            }
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}